

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O3

void __thiscall
Hpipe::CppEmitter::write_label(CppEmitter *this,StreamSepMaker *ss,uint num,char letter)

{
  bool bVar1;
  StreamSep *pSVar2;
  ostream *poVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  undefined8 uVar9;
  char local_1b5;
  uint local_1b4;
  long *local_1b0;
  undefined8 local_1a8;
  long local_1a0;
  undefined8 uStack_198;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  string local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string local_110;
  StreamSepMaker local_f0;
  StreamSep local_68;
  
  local_1b5 = letter;
  local_1b4 = num;
  StreamSepMaker::rm_beg(&local_f0,ss,2);
  StreamSepMaker::operator<<(&local_68,&local_f0,&local_1b5);
  pSVar2 = StreamSep::operator<<(&local_68,(char (*) [2])0x17da5e);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (pSVar2->stream,(pSVar2->sep)._M_dataplus._M_p,(pSVar2->sep)._M_string_length);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  pSVar2 = StreamSep::operator<<(pSVar2,(char (*) [2])0x17b6f7);
  bVar1 = this->trace_labels;
  if (bVar1 != true) {
    local_170 = &local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
    goto LAB_00147c6a;
  }
  to_string<char>(&local_110,&local_1b5);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x17bb16);
  local_130 = &local_120;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_120 = *plVar6;
    lStack_118 = plVar4[3];
  }
  else {
    local_120 = *plVar6;
    local_130 = (long *)*plVar4;
  }
  local_128 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_180 = *puVar7;
    lStack_178 = plVar4[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar7;
    local_190 = (ulong *)*plVar4;
  }
  local_188 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  to_string<unsigned_int>(&local_150,&local_1b4);
  uVar8 = 0xf;
  if (local_190 != &local_180) {
    uVar8 = local_180;
  }
  if (uVar8 < local_150._M_string_length + local_188) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      uVar9 = local_150.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_150._M_string_length + local_188) goto LAB_00147bb3;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_00147bb3:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_150._M_dataplus._M_p);
  }
  local_1b0 = &local_1a0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_1a0 = *plVar4;
    uStack_198 = puVar5[3];
  }
  else {
    local_1a0 = *plVar4;
    local_1b0 = (long *)*puVar5;
  }
  local_1a8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  local_170 = &local_160;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_160 = *plVar6;
    lStack_158 = plVar4[3];
  }
  else {
    local_160 = *plVar6;
    local_170 = (long *)*plVar4;
  }
  local_168 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
LAB_00147c6a:
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (pSVar2->stream,(pSVar2->sep)._M_dataplus._M_p,(pSVar2->sep)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_170,local_168);
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (bVar1 != false) {
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  StreamSep::~StreamSep(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.end._M_dataplus._M_p != &local_f0.end.field_2) {
    operator_delete(local_f0.end._M_dataplus._M_p,local_f0.end.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.sep._M_dataplus._M_p != &local_f0.sep.field_2) {
    operator_delete(local_f0.sep._M_dataplus._M_p,local_f0.sep.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.beg._M_dataplus._M_p != &local_f0.beg.field_2) {
    operator_delete(local_f0.beg._M_dataplus._M_p,local_f0.beg.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.first_beg._M_dataplus._M_p != &local_f0.first_beg.field_2) {
    operator_delete(local_f0.first_beg._M_dataplus._M_p,
                    local_f0.first_beg.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CppEmitter::write_label( StreamSepMaker &ss, unsigned num, char letter ) {
    ss.rm_beg( 2 ) << letter << "_" << num << ":" << ( trace_labels ? " std::cout << \"" + to_string( letter ) + "_" + to_string( num ) + "\\t\" << __LINE__ << std::endl;" : "" );
}